

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,double kappa,double delta,double theta)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> _Var9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  _Head_base<0UL,_int_*,_false> _Var13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var17;
  tuple<int_*,_std::default_delete<int[]>_> tVar18;
  row_iterator prVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 in_XMM3_Qb;
  undefined1 local_90 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_80;
  long local_78;
  undefined1 local_70 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_60;
  double local_58;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_50;
  _Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_40;
  long local_38;
  
  local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
  dVar23 = kappa / (1.0 - kappa);
  local_58 = theta;
  local_50._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )last._M_current;
  do {
    if ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
         )first._M_current ==
        (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
         )local_50._M_t.
          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl) {
      return false;
    }
    tVar18.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
         (long)((row_value *)first._M_current)->value;
    if (*(int *)(this + 0x80) <= ((row_value *)first._M_current)->value) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar16 = (int)local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
    local_48.super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (_Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>)
         (_Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>)first._M_current;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_90,iVar16);
    solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,local_58);
    _Var17._M_head_impl = (col_value *)0x0;
    for (_Var13._M_head_impl = (int *)local_90._8_8_; _Var13._M_head_impl != (int *)local_90._0_8_;
        _Var13._M_head_impl = _Var13._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)local_70,iVar16);
      lVar20 = *(long *)(this + 0x48);
      auVar24 = ZEXT816(0) << 0x40;
      while (local_70._8_8_ != local_70._0_8_) {
        iVar6 = *(int *)local_70._8_8_;
        local_70._8_8_ = local_70._8_8_ + 8;
        auVar29._0_8_ = (double)*(int *)(lVar20 + (long)iVar6 * 4);
        auVar29._8_8_ = in_XMM3_Qb;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(*(long *)(this + 0x68) + (long)iVar6 * 8);
        auVar24 = vfmadd231sd_fma(auVar24,auVar29,auVar2);
      }
      lVar14 = *(long *)(this + 0x50);
      lVar12 = (long)_Var17._M_head_impl * 0x10;
      *(int *)(lVar14 + 8 + lVar12) = (int)_Var17._M_head_impl;
      _Var17._M_head_impl = (col_value *)((long)&(_Var17._M_head_impl)->value + 1);
      *(undefined4 *)(lVar14 + 0xc + lVar12) =
           *(undefined4 *)(lVar20 + (long)*_Var13._M_head_impl * 4);
      *(double *)(lVar14 + lVar12) =
           *(double *)
            (*(long *)(*(long *)(this + 0x70) + 8) + (long)*(int *)(local_90._8_8_ + 4) * 8) -
           auVar24._0_8_;
    }
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*>
              (*(rc_data **)(this + 0x50),
               *(rc_data **)(this + 0x50) + ((ulong)_Var17._M_head_impl & 0xffffffff),
               *(random_engine **)this);
    lVar20 = *(long *)(this + 0x58);
    local_78 = (long)tVar18.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl * 0xc;
    local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)
         (tuple<int_*,_std::default_delete<int[]>_>)
         tVar18.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    local_40._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )_Var17._M_head_impl;
    if (*(int *)(lVar20 + local_78) < 1) {
      iVar16 = 0;
      uVar22 = 0xffffffffffffffff;
LAB_0017bee3:
      bVar10 = iVar16 <= *(int *)(lVar20 + 4 + local_78);
    }
    else {
      lVar21 = -0x100000000;
      lVar12 = 0;
      local_38 = (long)((int)_Var17._M_head_impl + -2);
      lVar20 = *(long *)(this + 0x50);
      iVar16 = 0;
      lVar14 = -1;
      do {
        uVar8 = local_90._8_8_;
        iVar16 = iVar16 + *(int *)(lVar20 + 0xc + lVar12);
        lVar21 = lVar21 + 0x100000000;
        iVar6 = *(int *)(lVar20 + 8 + lVar12);
        iVar7 = *(int *)(*(long *)(this + 0x58) + local_78);
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_90._8_8_ + (long)iVar6 * 8))->column);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar23;
        lVar20 = *(long *)(this + 0x50);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = delta;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(double *)(lVar20 + lVar12) * 0.5;
        auVar24 = vfmadd213sd_fma(auVar25,auVar30,auVar24);
        *(double *)
         (*(long *)(this + 0x68) + (long)((row_iterator)(uVar8 + (long)iVar6 * 8))->value * 8) =
             auVar24._0_8_ +
             *(double *)
              (*(long *)(this + 0x68) + (long)((row_iterator)(uVar8 + (long)iVar6 * 8))->value * 8);
        if (iVar7 <= iVar16) break;
        lVar12 = lVar12 + 0x10;
        bVar10 = lVar14 < local_38;
        lVar14 = lVar14 + 1;
      } while (bVar10);
      lVar20 = *(long *)(this + 0x58);
      uVar22 = lVar21 >> 0x20;
      if (*(int *)(lVar20 + local_78) <= iVar16) goto LAB_0017bee3;
      bVar10 = false;
    }
    uVar11 = (ulong)(int)local_40._M_t.
                         super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                         .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                         _M_head_impl;
    lVar20 = uVar22 << 4;
    uVar15 = uVar22;
    while( true ) {
      _Var9._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)local_80;
      uVar15 = uVar15 + 1;
      uVar22 = uVar22 + 1;
      if ((uVar11 <= uVar22) || (!bVar10)) break;
      lVar14 = *(long *)(this + 0x50);
      iVar16 = iVar16 + *(int *)(lVar14 + 0x1c + lVar20);
      if (iVar16 < *(int *)(*(long *)(this + 0x58) + local_78)) {
        prVar19 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar14 + 0x18 + lVar20) * 8);
LAB_0017bfa8:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar19->column);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar23;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = delta;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar20) * 0.5;
        auVar24 = vfmadd213sd_fma(auVar27,auVar32,auVar4);
        *(double *)(*(long *)(this + 0x68) + (long)prVar19->value * 8) =
             *(double *)(*(long *)(this + 0x68) + (long)prVar19->value * 8) - auVar24._0_8_;
        bVar10 = false;
      }
      else {
        prVar19 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar14 + 0x18 + lVar20) * 8);
        if ((*(int *)(*(long *)(this + 0x58) + local_78 + 4) < iVar16) ||
           (bVar10 = stop_iterating<baryonyx::itm::minimize_tag,double>
                               (*(double *)(lVar14 + 0x10 + lVar20),*(random_engine **)this),
           !bVar10)) goto LAB_0017bfa8;
        bit_array_impl::set(&x->super_bit_array_impl,prVar19->column);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar23;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = delta;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar20) * 0.5;
        auVar24 = vfmadd213sd_fma(auVar26,auVar31,auVar3);
        *(double *)(*(long *)(this + 0x68) + (long)prVar19->value * 8) =
             auVar24._0_8_ + *(double *)(*(long *)(this + 0x68) + (long)prVar19->value * 8);
        bVar10 = true;
      }
      lVar20 = lVar20 + 0x10;
    }
    while (uVar8 = local_90._8_8_, uVar15 < uVar11) {
      iVar16 = *(int *)(*(long *)(this + 0x50) + 0x18 + lVar20);
      bit_array_impl::unset
                (&x->super_bit_array_impl,
                 ((row_iterator)(local_90._8_8_ + (long)iVar16 * 8))->column);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar23;
      uVar15 = uVar15 + 1;
      pdVar1 = (double *)(*(long *)(this + 0x50) + 0x10 + lVar20);
      lVar20 = lVar20 + 0x10;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = delta;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *pdVar1 * 0.5;
      auVar24 = vfmadd213sd_fma(auVar28,auVar33,auVar5);
      *(double *)
       (*(long *)(this + 0x68) + (long)((row_iterator)(uVar8 + (long)iVar16 * 8))->value * 8) =
           *(double *)
            (*(long *)(this + 0x68) + (long)((row_iterator)(uVar8 + (long)iVar16 * 8))->value * 8) -
           auVar24._0_8_;
    }
    bVar10 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array>
                       ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                         *)this,(int)_Var9._M_t.
                                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                     super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
    if (!bVar10) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    first._M_current =
         (pair<int,_int> *)
         ((long)local_48.super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                _M_head_impl + 8);
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }